

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_line.cpp
# Opt level: O3

bool __thiscall ON_Line::IsFartherThan(ON_Line *this,double d,ON_Line *L)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  bool bVar4;
  ON_Line *point;
  undefined4 uVar5;
  uint uVar6;
  undefined4 uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  ON_3dVector local_78;
  ON_3dVector local_58;
  ON_3dPoint local_40;
  
  dVar8 = (this->from).x;
  dVar10 = (this->to).x;
  dVar9 = dVar8;
  if (dVar8 <= dVar10) {
    dVar9 = dVar10;
  }
  dVar1 = (L->from).x;
  dVar2 = (L->to).x;
  bVar4 = true;
  if ((dVar1 <= dVar9 + d) || (dVar2 <= dVar9 + d)) {
    if (dVar8 <= dVar10) {
      dVar10 = dVar8;
    }
    if ((dVar10 - d <= dVar1) || (dVar10 - d <= dVar2)) {
      dVar8 = (this->from).y;
      dVar10 = (this->to).y;
      dVar9 = dVar8;
      if (dVar8 <= dVar10) {
        dVar9 = dVar10;
      }
      dVar1 = (L->from).y;
      dVar2 = (L->to).y;
      if ((dVar1 <= dVar9 + d) || (dVar2 <= dVar9 + d)) {
        if (dVar8 <= dVar10) {
          dVar10 = dVar8;
        }
        if ((dVar10 - d <= dVar1) || (dVar10 - d <= dVar2)) {
          local_a0 = (this->from).z;
          dVar8 = (this->to).z;
          local_98 = dVar8;
          if (dVar8 < local_a0) {
            local_98 = local_a0;
            local_a0 = dVar8;
          }
          dVar8 = (L->from).z;
          dVar10 = (L->to).z;
          if (((dVar8 <= local_98 + d) || (dVar10 <= local_98 + d)) &&
             ((local_a0 - d <= dVar8 || (local_a0 - d <= dVar10)))) {
            local_88 = d;
            bVar3 = ON_Intersect(this,L,&local_a0,&local_98);
            if (!bVar3) {
              Direction(&local_58,this);
              Direction(&local_78,L);
              dVar8 = ON_3dVector::operator*(&local_58,&local_78);
              if (0.0 <= dVar8) {
                local_a0 = 0.0;
                point = this;
              }
              else {
                local_a0 = 1.0;
                point = (ON_Line *)&this->to;
              }
              ClosestPointTo(L,&point->from,&local_98);
              if (local_98 < 0.0) {
                local_98 = 0.0;
                ClosestPointTo(this,&L->from,&local_a0);
              }
            }
            PointAt((ON_3dPoint *)&local_58,this,local_a0);
            PointAt((ON_3dPoint *)&local_78,L,local_98);
            local_80 = ON_3dPoint::DistanceTo((ON_3dPoint *)&local_58,(ON_3dPoint *)&local_78);
            if (local_80 <= local_88) {
              uVar6 = 0;
              if ((local_a0 < 0.0) || (uVar6 = 0x3ff00000, 1.0 < local_a0)) {
                local_a0 = (double)((ulong)uVar6 << 0x20);
                PointAt(&local_40,this,(double)((ulong)uVar6 << 0x20));
                local_58.z = local_40.z;
                local_58.x = local_40.x;
                local_58.y = local_40.y;
                ClosestPointTo(L,(ON_3dPoint *)&local_58,&local_90);
                uVar5 = SUB84(local_90,0);
                uVar7 = (undefined4)((ulong)local_90 >> 0x20);
                if (0.0 <= local_90) {
                  if (1.0 < local_90) {
                    local_90 = 1.0;
                    uVar5 = 0;
                    uVar7 = 0x3ff00000;
                  }
                }
                else {
                  local_90 = 0.0;
                  uVar5 = 0;
                  uVar7 = 0;
                }
                PointAt(&local_40,L,(double)CONCAT44(uVar7,uVar5));
                local_80 = ON_3dPoint::DistanceTo(&local_40,(ON_3dPoint *)&local_58);
                bVar4 = true;
              }
              else {
                bVar4 = false;
              }
              uVar6 = 0;
              if ((local_98 < 0.0) || (uVar6 = 0x3ff00000, dVar8 = local_80, 1.0 < local_98)) {
                local_98 = (double)((ulong)uVar6 << 0x20);
                PointAt(&local_40,L,(double)((ulong)uVar6 << 0x20));
                local_78.z = local_40.z;
                local_78.x = local_40.x;
                local_78.y = local_40.y;
                ClosestPointTo(this,(ON_3dPoint *)&local_78,&local_90);
                uVar5 = SUB84(local_90,0);
                uVar7 = (undefined4)((ulong)local_90 >> 0x20);
                if (0.0 <= local_90) {
                  if (1.0 < local_90) {
                    local_90 = 1.0;
                    uVar5 = 0;
                    uVar7 = 0x3ff00000;
                  }
                }
                else {
                  local_90 = 0.0;
                  uVar5 = 0;
                  uVar7 = 0;
                }
                PointAt(&local_40,this,(double)CONCAT44(uVar7,uVar5));
                dVar10 = ON_3dPoint::DistanceTo(&local_40,(ON_3dPoint *)&local_78);
                dVar8 = dVar10;
                if ((bVar4) && (dVar8 = local_80, dVar10 < local_80)) {
                  dVar8 = dVar10;
                }
              }
              bVar4 = local_88 < dVar8;
            }
          }
        }
      }
    }
  }
  return bVar4;
}

Assistant:

bool ON_Line::IsFartherThan( double d, const ON_Line& L ) const
{
  ON_3dPoint A, B;
  double a, b, t, x;
  bool bCheckA, bCheckB;

  a = from.x; if (to.x < a) {b=a; a = to.x;} else b = to.x;
  if ( b+d < L.from.x && b+d < L.to.x )
    return true;
  if ( a-d > L.from.x && a-d > L.to.x )
    return true;

  a = from.y; if (to.y < a) {b=a; a = to.y;} else b = to.y;
  if ( b+d < L.from.y && b+d < L.to.y )
    return true;
  if ( a-d > L.from.y && a-d > L.to.y )
    return true;

  a = from.z; if (to.z < a) {b=a; a = to.z;} else b = to.z;
  if ( b+d < L.from.z && b+d < L.to.z )
    return true;
  if ( a-d > L.from.z && a-d > L.to.z )
    return true;

  if ( !ON_Intersect(*this,L,&a,&b) )
  {
    // lines are parallel or anti parallel
    if ( Direction()*L.Direction() >= 0.0 )
    {
      // lines are parallel
      a = 0.0;
      L.ClosestPointTo(from,&b);
      // If ( b >= 0.0), then this->from and L(b) are a pair of closest points.
      if ( b < 0.0 )
      {
        // Otherwise L.from and this(a) are a pair of closest points.
        b = 0.0;
        ClosestPointTo(L.from,&a);
      }
    }
    else
    {
      // lines are anti parallel
      a = 1.0;
      L.ClosestPointTo(to,&b);
      // If ( b >= 0.0), then this->to and L(b) are a pair of closest points.
      if ( b < 0.0 )
      {
        // Otherwise L.to and this(a) are a pair of closest points.
        b = 0.0;
        ClosestPointTo(L.from,&a);
      }
    }
  }

  A = PointAt(a);
  B = L.PointAt(b);
  x = A.DistanceTo(B);
  if (x > d)
    return true;

  bCheckA = true;
  if ( a < 0.0) a = 0.0; else if (a > 1.0) a = 1.0; else bCheckA=false;
  if (bCheckA )
  {
    A = PointAt(a);
    L.ClosestPointTo(A,&t);
    if (t<0.0) t = 0.0; else if (t > 1.0) t = 1.0;
    x = L.PointAt(t).DistanceTo(A);
  }

  bCheckB = true;
  if ( b < 0.0) b = 0.0; else if (b > 1.0) b = 1.0; else bCheckB=false;
  if ( bCheckB )
  {
    B = L.PointAt(b);
    ClosestPointTo(B,&t);
    if (t<0.0) t = 0.0; else if (t > 1.0) t = 1.0;
    t = PointAt(t).DistanceTo(B);
    if ( bCheckA )
    {
      if ( t<x ) x = t;
    }
    else
    {
      x = t;
    }
  }
 
  return (x > d);
}